

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dyndep_parser_test.cc
# Opt level: O1

void __thiscall DyndepParserTestOtherOutput::Run(DyndepParserTestOtherOutput *this)

{
  int iVar1;
  pointer ppEVar2;
  _Base_ptr p_Var3;
  _Base_ptr p_Var4;
  _Rb_tree_header *p_Var5;
  bool bVar6;
  
  iVar1 = g_current_test->assertion_failures_;
  DyndepParserTest::AssertParse
            (&this->super_DyndepParserTest,"ninja_dyndep_version = 1\nbuild otherout: dyndep\n");
  if (iVar1 == g_current_test->assertion_failures_) {
    testing::Test::Check
              (g_current_test,
               (this->super_DyndepParserTest).dyndep_file_.
               super_map<Edge_*,_Dyndeps,_std::less<Edge_*>,_std::allocator<std::pair<Edge_*const,_Dyndeps>_>_>
               ._M_t._M_impl.super__Rb_tree_header._M_node_count == 1,
               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/dyndep_parser_test.cc"
               ,0x1dd,"1u == dyndep_file_.size()");
    ppEVar2 = (this->super_DyndepParserTest).state_.edges_.
              super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.super__Vector_impl_data.
              _M_start;
    p_Var4 = *(_Base_ptr *)
              ((long)&(this->super_DyndepParserTest).dyndep_file_.
                      super_map<Edge_*,_Dyndeps,_std::less<Edge_*>,_std::allocator<std::pair<Edge_*const,_Dyndeps>_>_>
                      ._M_t._M_impl.super__Rb_tree_header._M_header + 8);
    p_Var5 = &(this->super_DyndepParserTest).dyndep_file_.
              super_map<Edge_*,_Dyndeps,_std::less<Edge_*>,_std::allocator<std::pair<Edge_*const,_Dyndeps>_>_>
              ._M_t._M_impl.super__Rb_tree_header;
    p_Var3 = &p_Var5->_M_header;
    if (p_Var4 != (_Base_ptr)0x0) {
      do {
        bVar6 = *(Edge **)(p_Var4 + 1) < *ppEVar2;
        if (!bVar6) {
          p_Var3 = p_Var4;
        }
        p_Var4 = (&p_Var4->_M_left)[bVar6];
      } while (p_Var4 != (_Base_ptr)0x0);
    }
    p_Var4 = &p_Var5->_M_header;
    if (((_Rb_tree_header *)p_Var3 != p_Var5) &&
       (p_Var4 = p_Var3, *ppEVar2 < *(Edge **)(p_Var3 + 1))) {
      p_Var4 = &p_Var5->_M_header;
    }
    bVar6 = testing::Test::Check
                      (g_current_test,(_Rb_tree_header *)p_Var4 != p_Var5,
                       "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/dyndep_parser_test.cc"
                       ,0x1df,"i != dyndep_file_.end()");
    if (bVar6) {
      testing::Test::Check
                (g_current_test,*(char *)((long)&p_Var4[1]._M_parent + 1) == '\0',
                 "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/dyndep_parser_test.cc"
                 ,0x1e0,"false == i->second.restat_");
      testing::Test::Check
                (g_current_test,p_Var4[2]._M_left == p_Var4[2]._M_parent,
                 "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/dyndep_parser_test.cc"
                 ,0x1e1,"0u == i->second.implicit_outputs_.size()");
      testing::Test::Check
                (g_current_test,p_Var4[1]._M_right == p_Var4[1]._M_left,
                 "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/dyndep_parser_test.cc"
                 ,0x1e2,"0u == i->second.implicit_inputs_.size()");
      return;
    }
    g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
  }
  else {
    g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
  }
  return;
}

Assistant:

TEST_F(DyndepParserTest, OtherOutput) {
  ASSERT_NO_FATAL_FAILURE(AssertParse(
"ninja_dyndep_version = 1\n"
"build otherout: dyndep\n"));

  EXPECT_EQ(1u, dyndep_file_.size());
  DyndepFile::iterator i = dyndep_file_.find(state_.edges_[0]);
  ASSERT_NE(i, dyndep_file_.end());
  EXPECT_EQ(false, i->second.restat_);
  EXPECT_EQ(0u, i->second.implicit_outputs_.size());
  EXPECT_EQ(0u, i->second.implicit_inputs_.size());
}